

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_dec.cc
# Opt level: O0

size_t woff2::anon_unknown_0::StoreOffsetTable
                 (uint8_t *result,size_t offset,uint32_t flavor,uint16_t num_tables)

{
  uint uVar1;
  size_t sVar2;
  undefined4 local_24;
  uint16_t output_search_range;
  uint max_pow2;
  uint16_t num_tables_local;
  uint32_t flavor_local;
  size_t offset_local;
  uint8_t *result_local;
  
  sVar2 = StoreU32(result,offset,flavor);
  sVar2 = Store16(result,sVar2,(uint)num_tables);
  local_24 = 0;
  while ((uint)(1 << ((byte)local_24 + 1 & 0x1f)) <= (uint)num_tables) {
    local_24 = local_24 + 1;
  }
  uVar1 = (1 << ((byte)local_24 & 0x1f)) << 4;
  sVar2 = Store16(result,sVar2,uVar1 & 0xffff);
  sVar2 = Store16(result,sVar2,local_24);
  sVar2 = Store16(result,sVar2,(uint)num_tables * 0x10 - (uVar1 & 0xffff));
  return sVar2;
}

Assistant:

size_t StoreOffsetTable(uint8_t* result, size_t offset, uint32_t flavor,
                        uint16_t num_tables) {
  offset = StoreU32(result, offset, flavor);  // sfnt version
  offset = Store16(result, offset, num_tables);  // num_tables
  unsigned max_pow2 = 0;
  while (1u << (max_pow2 + 1) <= num_tables) {
    max_pow2++;
  }
  const uint16_t output_search_range = (1u << max_pow2) << 4;
  offset = Store16(result, offset, output_search_range);  // searchRange
  offset = Store16(result, offset, max_pow2);  // entrySelector
  // rangeShift
  offset = Store16(result, offset, (num_tables << 4) - output_search_range);
  return offset;
}